

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O0

int trupdate(custom_function *funcpt,double *xi,double *jac,double *step,int N,double *dx,
            double maxstep,int retcode,double *L,double *hess,double stol,int method,double *ioval,
            double *xprev,double *funcprev,double *x)

{
  double dVar1;
  double *C;
  double *array;
  double dVar2;
  double dVar3;
  double dVar4;
  double *rcheck;
  double *slopei;
  double temp;
  double dfp;
  double df;
  double funcf;
  double funci;
  double deltatemp;
  double den;
  double rell;
  double nlen;
  double alpha;
  double delta;
  int c1;
  int j;
  int i;
  int retval;
  double stol_local;
  double maxstep_local;
  double *dx_local;
  int N_local;
  double *step_local;
  double *jac_local;
  double *xi_local;
  custom_function *funcpt_local;
  
  dVar1 = *ioval;
  rell = 0.0;
  C = (double *)malloc(8);
  array = (double *)malloc((long)N << 3);
  for (c1 = 0; c1 < N; c1 = c1 + 1) {
    rell = dx[c1] * step[c1] * dx[c1] * step[c1] + rell;
  }
  dVar2 = sqrt(rell);
  dVar3 = (*funcpt->funcpt)(xi,N,funcpt->params);
  if ((1.79769313486232e+308 <= dVar3) || (dVar3 <= -1.79769313486232e+308)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    free(array);
    free(C);
    funcpt_local._4_4_ = 0xf;
  }
  else if (NAN(dVar3)) {
    printf("Program Exiting as the function returns NaN");
    free(array);
    free(C);
    funcpt_local._4_4_ = 0xf;
  }
  else {
    madd(xi,step,x,1,N);
    dVar4 = (*funcpt->funcpt)(x,N,funcpt->params);
    if ((1.79769313486232e+308 <= dVar4) || (dVar4 <= -1.79769313486232e+308)) {
      printf("Program Exiting as the function value exceeds the maximum double value");
      free(array);
      free(C);
      funcpt_local._4_4_ = 0xf;
    }
    else if (NAN(dVar4)) {
      printf("Program Exiting as the function returns NaN");
      free(array);
      free(C);
      funcpt_local._4_4_ = 0xf;
    }
    else {
      dVar3 = dVar4 - dVar3;
      mmult(jac,step,C,1,N,1);
      if (retcode != 3) {
        *funcprev = 0.0;
      }
      if (((dVar3 <= *C * 0.0001) && (dVar4 < *funcprev)) || (retcode != 3)) {
        alpha = dVar1;
        if (dVar3 < *C * 0.0001) {
          temp = *C;
          if (method == 0) {
            for (c1 = 0; c1 < N; c1 = c1 + 1) {
              slopei = (double *)(hess[c1 * N + c1] * 0.5 * step[c1] * step[c1]);
              delta._4_4_ = c1;
              while (delta._4_4_ = delta._4_4_ + 1, delta._4_4_ < N) {
                slopei = (double *)
                         (hess[c1 * N + delta._4_4_] * step[c1] * step[delta._4_4_] + (double)slopei
                         );
              }
              temp = (double)slopei + temp;
            }
          }
          else if (method == 1) {
            for (c1 = 0; c1 < N; c1 = c1 + 1) {
              slopei = (double *)0x0;
              for (delta._4_4_ = c1; delta._4_4_ < N; delta._4_4_ = delta._4_4_ + 1) {
                slopei = (double *)(L[delta._4_4_ * N + c1] * step[delta._4_4_] + (double)slopei);
              }
              temp = ((double)slopei * (double)slopei) / 2.0 + temp;
            }
          }
          if ((((retcode == 2) || ((ABS(dVar3) < ABS(temp - dVar3) && (*C < dVar3)))) ||
              (ioval[6] != 0.0)) || ((NAN(ioval[6]) || (maxstep * 0.99 < dVar1)))) {
            j = 0;
            if (dVar3 < temp * 0.1) {
              if ((dVar3 <= temp * 0.75) && (alpha = maxstep, dVar1 * 2.0 < maxstep)) {
                alpha = dVar1 * 2.0;
              }
            }
            else {
              alpha = dVar1 / 2.0;
            }
          }
          else {
            j = 3;
            *funcprev = dVar4;
            for (c1 = 0; c1 < N; c1 = c1 + 1) {
              xprev[c1] = x[c1];
            }
            alpha = maxstep;
            if (dVar1 * 2.0 < maxstep) {
              alpha = dVar1 * 2.0;
            }
          }
        }
        else {
          for (c1 = 0; c1 < N; c1 = c1 + 1) {
            if (ABS(xi[c1]) <= 1.0 / ABS(dx[c1])) {
              deltatemp = 1.0 / ABS(dx[c1]);
            }
            else {
              deltatemp = ABS(xi[c1]);
            }
            array[c1] = step[c1] / deltatemp;
          }
          dVar4 = array_max_abs(array,N);
          if (stol <= dVar4) {
            j = 2;
            alpha = (-*C * dVar2) / ((dVar3 - dVar2) * 2.0);
            if (dVar1 * 0.1 <= alpha) {
              if (dVar1 * 0.5 < alpha) {
                alpha = dVar1 * 0.5;
              }
            }
            else {
              alpha = dVar1 * 0.1;
            }
          }
          else {
            j = 1;
            for (c1 = 0; c1 < N; c1 = c1 + 1) {
              x[c1] = xi[c1];
            }
          }
        }
      }
      else {
        for (c1 = 0; c1 < N; c1 = c1 + 1) {
          x[c1] = xprev[c1];
        }
        j = 0;
        alpha = dVar1 / 2.0;
      }
      *ioval = alpha;
      free(array);
      free(C);
      funcpt_local._4_4_ = j;
    }
  }
  return funcpt_local._4_4_;
}

Assistant:

int trupdate(custom_function *funcpt,double *xi,double *jac,double *step,int N,double * dx,double maxstep,
		int retcode,double *L,double *hess,double stol,int method,double *ioval,double *xprev,double *funcprev,double *x) {
			
	int retval;	
	int i,j,c1;
	double delta,alpha,nlen,rell,den,deltatemp;
	double funci,funcf,df,dfp,temp;
	double *slopei,*rcheck;
	/*Return Codes
	 * 
	 * 0 - x Accepted.
	 * 1 - x unsatisfactory but (x-xi) is smaller than stopping criteria stol
	 * 2 - f(x) large. Reduce delta
	 * 3 - f(x) sufficiently small. Double delta
	 * 
	 */ 
	 
	alpha = 1.0e-04;
	delta = ioval[0];
	nlen = 0.0;
	 
	slopei = (double*) malloc(sizeof(double) *1);
	rcheck = (double*) malloc(sizeof(double) *N);
 
	for(i = 0; i < N;++i) {
		nlen += dx[i] * step[i] * dx[i] * step[i];
	}
	nlen = sqrt(nlen);
	
	
	funci = FUNCPT_EVAL(funcpt, xi, N);
	if (funci >= DBL_MAX || funci <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(rcheck);
		free(slopei);
		return 15;
	}
	if (funci != funci) {
		printf("Program Exiting as the function returns NaN");
		free(rcheck);
		free(slopei);
		return 15;
	}
	
	madd(xi,step,x,1,N);
	
	funcf = FUNCPT_EVAL(funcpt, x, N);
	if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(rcheck);
		free(slopei);
		return 15;
	}
	if (funcf != funcf) {
		printf("Program Exiting as the function returns NaN");
		free(rcheck);
		free(slopei);
		return 15;
	}
	
	df = funcf - funci;
	mmult(jac,step,slopei,1,N,1);
	 
	if (retcode != 3) {
		*funcprev = 0.;
	} 
	
	if ((df > alpha *slopei[0] || funcf >= *funcprev) && retcode == 3) {
		for(i = 0;i < N;++i) {
			x[i] = xprev[i];
		}
		retval = 0;
		funcf = *funcprev;
		delta /= 2.0;
	} else if (df >= alpha *slopei[0]) {
		for(i = 0; i < N;++i) {
			if (fabs(xi[i]) > 1.0 /fabs(dx[i])) {
				den = fabs(xi[i]);
			} else {
				den = 1.0 /fabs(dx[i]);
			}
			rcheck[i] = step[i]/den;
		}
	
		rell = array_max_abs(rcheck,N);
		
		if (rell < stol) {
			retval = 1;
			for(i = 0; i < N;++i) {
				x[i] = xi[i];
			}
		} else {
			retval = 2;
			deltatemp = - slopei[0] * nlen /(2*(df - nlen));
			if (deltatemp < 0.1 * delta) {
				delta *= 0.1;
			} else if (deltatemp > 0.5 * delta) {
				delta *= 0.5;
			} else {
				delta = deltatemp;
			}
		}
		
	} else {
		dfp = slopei[0];
		if (method == 0) {
			for (i = 0;i < N;++i) {
				//Hook
				c1 = i * N;
				temp = 0.5 * hess[c1+i] * step[i] * step[i];
				for (j = i+1; j < N;++j) {
					temp += hess[c1+j] * step[i] * step[j];
				}
				dfp += temp;
			}
		} else if (method == 1) {
			//Double Dogleg
			for (i = 0; i < N;++i) {
				temp = 0.0;
				for(j = i; j < N;++j) {
					temp += L[j*N+i] * step[j];
				}
				dfp += temp*temp/2.0;
			}
		}
		
		if ((retcode != 2) && (fabs(dfp - df) <= fabs(df) || df <= slopei[0]) && (ioval[6] == 0.0) && (delta <= 0.99*maxstep)) {
			retval = 3;
			*funcprev = funcf;
			for(i = 0; i < N;++i) {
				xprev[i] = x[i];
			}
			if (maxstep > 2*delta) {
				delta = 2 * delta;
			} else {
				delta = maxstep;
			}
			
		} else {
			retval = 0;
			if (df >= 0.1 * dfp) {
				delta = delta/2;
			} else if (df <= 0.75 *dfp) {
				if (maxstep > 2*delta) {
				delta = 2 * delta;
				} else {
					delta = maxstep;
				}
				
			}
		}
	}
	
	
	ioval[0] = delta;
	free(rcheck);
	free(slopei); 
	return retval;
		
}